

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_id.c
# Opt level: O0

int csp_id2_strip(csp_packet_t *packet)

{
  __uint64_t _Var1;
  long in_RDI;
  uint64_t id2;
  undefined8 local_18;
  undefined4 local_4;
  
  if (*(ushort *)(in_RDI + 0x28) < 6) {
    local_4 = -1;
  }
  else {
    local_18 = (ulong)**(uint6 **)(in_RDI + 0x20);
    *(short *)(in_RDI + 0x2a) = *(short *)(in_RDI + 0x28) + -6;
    _Var1 = __bswap_64(local_18);
    *(byte *)(in_RDI + 0x2c) = (byte)(_Var1 >> 0x3e);
    *(ushort *)(in_RDI + 0x30) = (ushort)(_Var1 >> 0x30) & 0x3fff;
    *(ushort *)(in_RDI + 0x2e) = (ushort)(_Var1 >> 0x22) & 0x3fff;
    *(byte *)(in_RDI + 0x32) = (byte)(_Var1 >> 0x1c) & 0x3f;
    *(byte *)(in_RDI + 0x33) = (byte)(_Var1 >> 0x16) & 0x3f;
    *(byte *)(in_RDI + 0x2d) = (byte)(_Var1 >> 0x10) & 0x3f;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int csp_id2_strip(csp_packet_t * packet) {

	if (packet->frame_length < CSP_ID2_HEADER_SIZE) {
		return -1;
	}

	/* Get 48 bit in network byte order:
	 * Most significant byte ends in byte 0 */
	uint64_t id2 = 0;
	memcpy(&id2, packet->frame_begin, CSP_ID2_HEADER_SIZE);
	packet->length = packet->frame_length - CSP_ID2_HEADER_SIZE;

	/* Convert to host order:
	 * Most significant byte ends in byte 7, we then shift down
	 * to get MSB into byte 5 */
	id2 = be64toh(id2) >> 16;

	/* Parse header:
	 * Now in easy to work with in 32 bit register */
	packet->id.pri = (id2 >> CSP_ID2_PRIO_OFFSET) & CSP_ID2_PRIO_MASK;
	packet->id.dst = (id2 >> CSP_ID2_DST_OFFSET) & CSP_ID2_DST_MASK;
	packet->id.src = (id2 >> CSP_ID2_SRC_OFFSET) & CSP_ID2_SRC_MASK;
	packet->id.dport = (id2 >> CSP_ID2_DPORT_OFFSET) & CSP_ID2_DPORT_MASK;
	packet->id.sport = (id2 >> CSP_ID2_SPORT_OFFSET) & CSP_ID2_SPORT_MASK;
	packet->id.flags = (id2 >> CSP_ID2_FLAGS_OFFSET) & CSP_ID2_FLAGS_MASK;

	return 0;
}